

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O0

Quaternion QuaternionFromMatrix(Matrix mat)

{
  Quaternion QVar1;
  float fVar2;
  float in_stack_00000008;
  float in_stack_0000000c;
  float s_2;
  float s_1;
  float s;
  Quaternion result;
  
  memset(&s_1,0,0x10);
  if ((in_stack_00000008 <= mat.m12) || (in_stack_00000008 <= mat.m2)) {
    if (mat.m12 <= mat.m2) {
      fVar2 = sqrtf(((mat.m2 + 1.0) - in_stack_00000008) - mat.m12);
      fVar2 = fVar2 * 2.0;
      s_1 = (mat.m9 + mat.m0) / fVar2;
      s = (mat.m1 + mat.m13) / fVar2;
      result.x = fVar2 * 0.25;
      result.y = (in_stack_0000000c - mat.m8) / fVar2;
    }
    else {
      fVar2 = sqrtf(((mat.m12 + 1.0) - in_stack_00000008) - mat.m2);
      fVar2 = fVar2 * 2.0;
      s_1 = (in_stack_0000000c + mat.m8) / fVar2;
      s = fVar2 * 0.25;
      result.x = (mat.m1 + mat.m13) / fVar2;
      result.y = (mat.m9 - mat.m0) / fVar2;
    }
  }
  else {
    fVar2 = sqrtf(((in_stack_00000008 + 1.0) - mat.m12) - mat.m2);
    fVar2 = fVar2 * 2.0;
    s_1 = fVar2 * 0.25;
    s = (in_stack_0000000c + mat.m8) / fVar2;
    result.x = (mat.m9 + mat.m0) / fVar2;
    result.y = (mat.m1 - mat.m13) / fVar2;
  }
  QVar1.y = s;
  QVar1.x = s_1;
  QVar1.z = result.x;
  QVar1.w = result.y;
  return QVar1;
}

Assistant:

RMDEF Quaternion QuaternionFromMatrix(Matrix mat)
{
    Quaternion result = { 0 };

    if ((mat.m0 > mat.m5) && (mat.m0 > mat.m10))
    {
        float s = sqrtf(1.0f + mat.m0 - mat.m5 - mat.m10)*2;

        result.x = 0.25f*s;
        result.y = (mat.m4 + mat.m1)/s;
        result.z = (mat.m2 + mat.m8)/s;
        result.w = (mat.m9 - mat.m6)/s;
    }
    else if (mat.m5 > mat.m10)
    {
        float s = sqrtf(1.0f + mat.m5 - mat.m0 - mat.m10)*2;
        result.x = (mat.m4 + mat.m1)/s;
        result.y = 0.25f*s;
        result.z = (mat.m9 + mat.m6)/s;
        result.w = (mat.m2 - mat.m8)/s;
    }
    else
    {
        float s  = sqrtf(1.0f + mat.m10 - mat.m0 - mat.m5)*2;
        result.x = (mat.m2 + mat.m8)/s;
        result.y = (mat.m9 + mat.m6)/s;
        result.z = 0.25f*s;
        result.w = (mat.m4 - mat.m1)/s;
    }

    return result;
}